

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdl_controller.cpp
# Opt level: O0

void __thiscall
r_exec::PrimaryMDLController::abduce_simulated_lhs
          (PrimaryMDLController *this,HLPBindingMap *bm,Fact *super_goal,Fact *f_imdl,bool opposite,
          double confidence,Sim *sim)

{
  bool bVar1;
  MatchResult MVar2;
  Code *pCVar3;
  _Fact *p_Var4;
  Goal *this_00;
  Goal *this_01;
  uint64_t after;
  Fact *this_02;
  _GMonitor *m;
  P<r_exec::_Fact> s;
  Fact *f_sub_goal;
  uint64_t now;
  Goal *sub_goal;
  _Fact *evidence;
  P<r_exec::_Fact> local_48;
  P<r_exec::_Fact> bound_lhs;
  Sim *sim_local;
  double confidence_local;
  bool opposite_local;
  Fact *f_imdl_local;
  Fact *super_goal_local;
  HLPBindingMap *bm_local;
  PrimaryMDLController *this_local;
  
  bound_lhs.object = &sim->super__Object;
  bVar1 = HLPController::evaluate_bwd_guards((HLPController *)this,bm);
  if (bVar1) {
    pCVar3 = (Code *)MDLController::get_lhs((MDLController *)this);
    pCVar3 = HLPBindingMap::bind_pattern(bm,pCVar3);
    core::P<r_exec::_Fact>::P(&local_48,(_Fact *)pCVar3);
    if (opposite) {
      p_Var4 = core::P<r_exec::_Fact>::operator->(&local_48);
      _Fact::set_opposite(p_Var4);
    }
    p_Var4 = core::P<r_exec::_Fact>::operator->(&local_48);
    _Fact::set_cfd(p_Var4,confidence);
    p_Var4 = core::P::operator_cast_to__Fact_((P *)&local_48);
    MVar2 = HLPController::check_evidences((HLPController *)this,p_Var4,(_Fact **)&sub_goal);
    if (MVar2 == MATCH_SUCCESS_POSITIVE) {
      (**(code **)((long)(this->super_PMDLController).super_MDLController.super_HLPController.
                         super_OController.super_Controller.super__Object._vptr__Object + 0x80))
                (this,super_goal,1,sub_goal);
    }
    else if (MVar2 == MATCH_SUCCESS_NEGATIVE) {
      (**(code **)((long)(this->super_PMDLController).super_MDLController.super_HLPController.
                         super_OController.super_Controller.super__Object._vptr__Object + 0x80))
                (this,super_goal,0,sub_goal);
    }
    else if (MVar2 == MATCH_FAILURE) {
      p_Var4 = core::P::operator_cast_to__Fact_((P *)&local_48);
      MVar2 = HLPController::check_predicted_evidences
                        ((HLPController *)this,p_Var4,(_Fact **)&sub_goal);
      if (MVar2 == MATCH_SUCCESS_POSITIVE) {
        (**(code **)((long)(this->super_PMDLController).super_MDLController.super_HLPController.
                           super_OController.super_Controller.super__Object._vptr__Object + 0x80))
                  (this,super_goal,1,sub_goal);
      }
      else if (MVar2 == MATCH_SUCCESS_NEGATIVE) {
        (**(code **)((long)(this->super_PMDLController).super_MDLController.super_HLPController.
                           super_OController.super_Controller.super__Object._vptr__Object + 0x80))
                  (this,super_goal,0,sub_goal);
      }
      else if (MVar2 == MATCH_FAILURE) {
        pCVar3 = (Code *)(**(code **)((long)(f_imdl->super__Fact).super_LObject.
                                            super_Object<r_code::LObject,_r_exec::LObject>.
                                            super_LObject.super_Code.super__Object._vptr__Object +
                                     0x48))(f_imdl,0);
        pCVar3 = HLPBindingMap::bind_pattern(bm,pCVar3);
        (**(code **)((long)(f_imdl->super__Fact).super_LObject.
                           super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
                           super__Object._vptr__Object + 0x40))(f_imdl,0,pCVar3);
        this_00 = (Goal *)operator_new(0x160);
        p_Var4 = core::P::operator_cast_to__Fact_((P *)&local_48);
        this_01 = _Fact::get_goal(&super_goal->super__Fact);
        pCVar3 = Goal::get_actor(this_01);
        Goal::Goal(this_00,p_Var4,pCVar3,1.0);
        s = bound_lhs;
        core::P<r_exec::Sim>::operator=(&this_00->sim,(Sim *)bound_lhs.object);
        after = (*Now)();
        this_02 = (Fact *)Fact::operator_new((Fact *)0x150,(size_t)s.object);
        Fact::Fact(this_02,(Code *)this_00,after,after,1.0,1.0);
        m = (_GMonitor *)operator_new(0xb8);
        SGMonitor::SGMonitor
                  ((SGMonitor *)m,this,&bm->super_BindingMap,
                   (uint64_t)bound_lhs.object[2]._vptr__Object,this_02,f_imdl);
        PMDLController::add_g_monitor(&this->super_PMDLController,m);
        PMDLController::inject_simulation(&this->super_PMDLController,this_02);
      }
    }
    core::P<r_exec::_Fact>::~P(&local_48);
  }
  return;
}

Assistant:

void PrimaryMDLController::abduce_simulated_lhs(HLPBindingMap *bm, Fact *super_goal, Fact *f_imdl, bool opposite, double confidence, Sim *sim)   // goal is f->g->f->object or f->g->|f->object; called concurrently by redcue() and _GMonitor::update().
{
    if (evaluate_bwd_guards(bm)) { // bm may be updated.
        P<_Fact> bound_lhs = (_Fact *)bm->bind_pattern(get_lhs());

        if (opposite) {
            bound_lhs->set_opposite();
        }

        bound_lhs->set_cfd(confidence);
        _Fact *evidence;

        switch (check_evidences(bound_lhs, evidence)) {
        case MATCH_SUCCESS_POSITIVE: // an evidence is already known: stop the simulation.
            register_simulated_goal_outcome(super_goal, true, evidence);
            break;

        case MATCH_SUCCESS_NEGATIVE: // a counter evidence is already known: stop the simulation.
            register_simulated_goal_outcome(super_goal, false, evidence);
            break;

        case MATCH_FAILURE:
            switch (check_predicted_evidences(bound_lhs, evidence)) {
            case MATCH_SUCCESS_POSITIVE: // a predicted evidence is already known: stop the simulation.
                register_simulated_goal_outcome(super_goal, true, evidence);
                break;

            case MATCH_SUCCESS_NEGATIVE:
                register_simulated_goal_outcome(super_goal, false, evidence);
                break;

            case MATCH_FAILURE: {
                f_imdl->set_reference(0, bm->bind_pattern(f_imdl->get_reference(0))); // valuate f_imdl from updated bm.
                Goal *sub_goal = new Goal(bound_lhs, super_goal->get_goal()->get_actor(), 1);
                sub_goal->sim = sim;
                uint64_t now = Now();
                Fact *f_sub_goal = new Fact(sub_goal, now, now, 1, 1);
                add_g_monitor(new SGMonitor(this, bm, sim->thz, f_sub_goal, f_imdl));
                inject_simulation(f_sub_goal);
                break;
            }
            }

            break;
        }
    }
}